

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::Test::HasSameFixtureClass(void)

{
  ostream *poVar1;
  TestInfo *pTVar2;
  TestInfo *pTVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  AssertHelper local_50;
  Message local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  UnitTest::GetInstance();
  pTVar2 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pTVar3 = *((UnitTest::GetInstance::instance.impl_)->current_test_suite_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (undefined1 *)pTVar3->fixture_class_id_;
  local_40 = (undefined1 *)pTVar2->fixture_class_id_;
  if (local_40 != local_38) {
    pcVar6 = (pTVar3->name_)._M_dataplus._M_p;
    __s = (pTVar2->name_)._M_dataplus._M_p;
    if ((local_38 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (local_40 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      pcVar5 = pcVar6;
      if (local_38 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        pcVar5 = __s;
        __s = pcVar6;
      }
      Message::Message(&local_48);
      poVar1 = (ostream *)
               ((long)local_48.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"class, so mixing TEST_F and TEST in the same test suite is\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"illegal.  In test suite ",0x18);
      pcVar6 = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      if (pcVar6 == (char *)0x0) {
        sVar4 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar4 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"test ",5);
      if (pcVar5 == (char *)0x0) {
        sVar4 = 6;
        pcVar5 = "(null)";
      }
      else {
        sVar4 = strlen(pcVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," is defined using TEST_F but\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"test ",5);
      if (__s == (char *)0x0) {
        sVar4 = 6;
        __s = "(null)";
      }
      else {
        sVar4 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," is defined using TEST.  You probably\n",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"want to change the TEST to TEST_F or move it to another test\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"case.",5);
      internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                 ,0xa1c,"Failed");
      internal::AssertHelper::operator=(&local_50,&local_48);
    }
    else {
      Message::Message(&local_48);
      poVar1 = (ostream *)
               ((long)local_48.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"class.  However, in test suite ",0x1f);
      pcVar5 = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      if (pcVar5 == (char *)0x0) {
        sVar4 = 6;
        pcVar5 = "(null)";
      }
      else {
        sVar4 = strlen(pcVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"you defined test ",0x11);
      if (pcVar6 == (char *)0x0) {
        sVar4 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar4 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," and test ",10);
      if (__s == (char *)0x0) {
        sVar4 = 6;
        __s = "(null)";
      }
      else {
        sVar4 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"using two different test fixture classes.  This can happen if\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"the two classes are from different namespaces or translation\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"units and have the same name.  You should probably rename one\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"of the classes to put the tests into different test suites.",0x3b);
      internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                 ,0xa28,"Failed");
      internal::AssertHelper::operator=(&local_50,&local_48);
    }
    internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))
                (local_48.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    }
  }
  return local_40 == local_38;
}

Assistant:

void ScopedFakeTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  result_->Append(result);
}